

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::ConstantPlusX::forward_impl
          (ConstantPlusX *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> MStack_88;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_68;
  CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  local_48;
  
  Tensor::operator*(&local_68,
                    *(xs->
                     super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                     _M_impl.super__Vector_impl_data._M_start);
  local_48.m_functor.c = this->c;
  local_48.m_xpr.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_cols.m_value =
       local_68.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_cols.m_value;
  local_48.m_xpr.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = local_68.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_data;
  local_48.m_xpr.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_rows.m_value =
       local_68.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value;
  Tensor::operator*(&MStack_88,fx);
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseUnaryOp<cnn::const_add_op<float>,Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>const>>
            (&MStack_88,&local_48);
  return;
}

Assistant:

void ConstantPlusX::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("ConstantPlusX not yet implemented for CUDA");
#else
  auto x = **xs[0];
  *fx = x.unaryExpr(const_add_op<float>(c));
#endif
}